

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void mark(Object *object)

{
  undefined8 *puVar1;
  int i_1;
  long lVar2;
  ulong uVar3;
  int i;
  object_t *poVar4;
  uint8_t *puVar5;
  
  if (object->marked != '\0') {
    return;
  }
  if (object->type == OBJ_DICT) {
    for (uVar3 = 0; uVar3 < object[1].type; uVar3 = uVar3 + 1) {
      puVar5 = &(object[2].next)->marked + uVar3 * 8;
      while (puVar1 = *(undefined8 **)puVar5, puVar1 != (undefined8 *)0x0) {
        mark((Object *)*puVar1);
        if (*(int *)(puVar1 + 2) == 2) {
          mark((Object *)puVar1[3]);
        }
        puVar5 = (uint8_t *)(puVar1 + 4);
      }
    }
  }
  else if (object->type == OBJ_LIST) {
    lVar2 = 8;
    for (poVar4 = (object_t *)0x0; poVar4 < object[1].next; poVar4 = (object_t *)&poVar4->field_0x1)
    {
      if (*(int *)(*(long *)(object + 2) + -8 + lVar2) == 2) {
        mark(*(Object **)(*(long *)(object + 2) + lVar2));
      }
      lVar2 = lVar2 + 0x10;
    }
  }
  object->marked = '\x01';
  return;
}

Assistant:

static void mark(Object *object) {
    if (object->marked) { return; }

    if (object->type == OBJ_DICT) {
        ObjDict *dict = (ObjDict *) object;

        for (int i = 0; i < dict->content.cap; ++i) {
            HTItem *current = dict->content.buckets[i];

            while (current) {
                mark((Object *) current->key.key_obj_string);

                if (current->value.type == OBJECT) {
                    mark(current->value.o_value);
                }

                current = current->next;
            }
        }

    } else if (object->type == OBJ_LIST) {
        ObjList *list = (ObjList *) object;

        for (int i = 0; i < list->content.count; ++i) {
            CrispyValue *current = &list->content.values[i];

            if (current->type == OBJECT) {
                mark(current->o_value);
            }
        }
    }

    object->marked = 1;
}